

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O3

void Wln_NtkStaticFanoutStart(Wln_Ntk_t *p)

{
  uint uVar1;
  Wln_Vec_t *pWVar2;
  undefined8 *__ptr;
  int *piVar3;
  ulong uVar4;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar5;
  ulong uVar6;
  uint uVar7;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar8;
  void *__ptr_00;
  long lVar9;
  int iVar10;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar11;
  long lVar12;
  
  __ptr = (undefined8 *)malloc(0x10);
  Wln_NtkCreateRefs(p);
  Wln_NtkStartFanoutMap(p,&p->vFanout,&p->vRefs,1);
  piVar3 = (p->vRefs).pArray;
  *__ptr = *(undefined8 *)&p->vRefs;
  __ptr[1] = piVar3;
  (p->vRefs).nCap = 0;
  (p->vRefs).nSize = 0;
  (p->vRefs).pArray = (int *)0x0;
  iVar10 = (p->vTypes).nCap;
  lVar12 = (long)iVar10;
  if (0 < lVar12) {
    piVar3 = (p->vRefs).pArray;
    if (piVar3 == (int *)0x0) {
      piVar3 = (int *)malloc(lVar12 * 4);
    }
    else {
      piVar3 = (int *)realloc(piVar3,lVar12 * 4);
    }
    (p->vRefs).pArray = piVar3;
    if (piVar3 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vRefs).nCap = iVar10;
  }
  if (0 < iVar10) {
    memset((p->vRefs).pArray,0,lVar12 << 2);
  }
  (p->vRefs).nSize = iVar10;
  uVar7 = (p->vTypes).nSize;
  if ((int)uVar7 < 2) {
LAB_00386c12:
    __ptr_00 = (void *)__ptr[1];
    if (__ptr_00 == (void *)0x0) goto LAB_00386c20;
  }
  else {
    pWVar2 = p->vFanins;
    paVar5 = &pWVar2[1].field_2;
    lVar12 = 1;
    do {
      iVar10 = pWVar2[lVar12].nSize;
      if (0 < iVar10) {
        lVar9 = 0;
        paVar8 = paVar5;
        do {
          paVar11 = paVar8;
          if (2 < iVar10) {
            paVar11 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)
                      (pWVar2[lVar12].field_2.pArray[0] + lVar9);
          }
          uVar7 = paVar11->Array[0];
          uVar4 = (ulong)uVar7;
          if (uVar4 != 0) {
            if (((int)uVar7 < 0) || ((p->vRefs).nSize <= (int)uVar7)) {
LAB_00386c30:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
            }
            piVar3 = (p->vRefs).pArray;
            iVar10 = piVar3[uVar4];
            piVar3[uVar4] = iVar10 + 1;
            uVar1 = (p->vFanout).nSize;
            if ((int)uVar1 <= (int)uVar7) goto LAB_00386c4f;
            piVar3 = (p->vFanout).pArray;
            uVar7 = piVar3[uVar4];
            if (((long)(int)uVar7 < 0) || (uVar1 <= uVar7)) goto LAB_00386c30;
            piVar3[(long)(int)uVar7 + (long)iVar10] = (int)lVar12;
            iVar10 = pWVar2[lVar12].nSize;
          }
          lVar9 = lVar9 + 1;
          paVar8 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)((long)paVar8 + 4);
        } while (lVar9 < iVar10);
        uVar7 = (p->vTypes).nSize;
      }
      lVar12 = lVar12 + 1;
      paVar5 = paVar5 + 2;
    } while (lVar12 < (int)uVar7);
    if ((int)uVar7 < 2) goto LAB_00386c12;
    uVar1 = (p->vRefs).nSize;
    uVar4 = 1;
    if (1 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    uVar6 = 1;
    do {
      if ((uVar4 == uVar6) || ((long)*(int *)((long)__ptr + 4) <= (long)uVar6)) {
LAB_00386c4f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      __ptr_00 = (void *)__ptr[1];
      if ((p->vRefs).pArray[uVar6] != *(int *)((long)__ptr_00 + uVar6 * 4)) {
        __assert_fail("Wln_ObjRefs(p, iObj) == Vec_IntEntry(vRefsCopy, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnNtk.c"
                      ,0x1a4,"void Wln_NtkStaticFanoutStart(Wln_Ntk_t *)");
      }
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar6);
  }
  free(__ptr_00);
LAB_00386c20:
  free(__ptr);
  return;
}

Assistant:

void Wln_NtkStaticFanoutStart( Wln_Ntk_t * p )
{
    int k, iObj, iFanin;
    Vec_Int_t * vRefsCopy = Vec_IntAlloc(0);
    Wln_NtkCreateRefs( p );
    Wln_NtkStartFanoutMap( p, &p->vFanout, &p->vRefs, 1 );
    ABC_SWAP( Vec_Int_t, *vRefsCopy, p->vRefs );
    // add fanouts
    Wln_NtkCleanRefs( p );
    Wln_NtkForEachObj( p, iObj )
        Wln_ObjForEachFanin( p, iObj, iFanin, k )
            Wln_ObjSetFanout( p, iFanin, Wln_ObjRefsInc(p, iFanin), iObj );
    // double-check the current number of fanouts added
    Wln_NtkForEachObj( p, iObj )
        assert( Wln_ObjRefs(p, iObj) == Vec_IntEntry(vRefsCopy, iObj) );
    Vec_IntFree( vRefsCopy );
}